

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_typed_token_attr<tinyusdz::GeomBasisCurves::Basis>
                   (string *__return_storage_ptr__,
                   TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Basis> *attr,string *name,
                   uint32_t indent)

{
  Path *v;
  bool bVar1;
  ostream *poVar2;
  tinyusdz *this;
  long lVar3;
  uint32_t indent_00;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  Basis *ty;
  stringstream ss;
  allocator local_221;
  string *local_220;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  indent_00 = indent;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar1 = TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Basis>::authored(attr);
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_218,(pprint *)(ulong)indent,n);
    ::std::operator<<(local_1a8,(string *)&local_218);
    ::std::__cxx11::string::_M_dispose();
    poVar2 = ::std::operator<<(local_1a8,"uniform token ");
    ::std::operator<<(poVar2,(string *)name);
    local_220 = name;
    if (attr->_blocked == true) {
      ::std::operator<<(local_1a8," = None");
    }
    else {
      poVar2 = ::std::operator<<(local_1a8," = ");
      this = (tinyusdz *)
             TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Basis>::get_value(attr);
      to_string_abi_cxx11_(&local_1f8,this,ty);
      ::std::__cxx11::string::string((string *)&local_1d8,"\"",&local_221);
      quote(&local_218,&local_1f8,&local_1d8);
      ::std::operator<<(poVar2,(string *)&local_218);
      ::std::__cxx11::string::_M_dispose();
      name = local_220;
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    bVar1 = AttrMetas::authored(&attr->_metas);
    if (bVar1) {
      poVar2 = ::std::operator<<(local_1a8," (\n");
      print_attr_metas_abi_cxx11_
                (&local_218,(tinyusdz *)attr,(AttrMeta *)(ulong)(indent + 1),indent_00);
      poVar2 = ::std::operator<<(poVar2,(string *)&local_218);
      pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)(ulong)indent,n_00);
      name = local_220;
      poVar2 = ::std::operator<<(poVar2,(string *)&local_1f8);
      ::std::operator<<(poVar2,")");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::operator<<(local_1a8,"\n");
    if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pprint::Indent_abi_cxx11_(&local_218,(pprint *)(ulong)indent,n_01);
      ::std::operator<<(local_1a8,(string *)&local_218);
      ::std::__cxx11::string::_M_dispose();
      poVar2 = ::std::operator<<(local_1a8,"token ");
      ::std::operator<<(poVar2,(string *)name);
      ::std::operator<<(local_1a8,".connect = ");
      v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
          .super__Vector_impl_data._M_start;
      lVar3 = ((long)(attr->_paths).
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)v) / 0xd0;
      if (lVar3 == 0) {
        ::std::operator<<(local_1a8,"[InternalError]");
      }
      else if (lVar3 == 1) {
        ::std::operator<<(local_1a8,v);
      }
      else {
        ::std::operator<<(local_1a8,&attr->_paths);
      }
      ::std::operator<<(local_1a8,"\n");
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_token_attr(const TypedAttributeWithFallback<T> &attr,
                                   const std::string &name,
                                   const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    ss << pprint::Indent(indent);

    ss << "uniform token " << name;

    if (attr.is_blocked()) {
      ss << " = None";
    } else {
      ss << " = " << quote(to_string(attr.get_value()));
    }

    if (attr.metas().authored()) {
      ss << " (\n"
         << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
         << ")";
    }
    ss << "\n";

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);

      ss << "token " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }
  }

  return ss.str();
}